

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O2

void __thiscall
tchecker::ta::ta_t::initial
          (ta_t *this,initial_value_t *init_edge,
          vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>_>_>
          *v,state_status_t mask)

{
  system_t *system;
  state_status_t sVar1;
  state_t *s_00;
  transition_t *t_00;
  transition_sptr_t t;
  state_sptr_t s;
  undefined1 auStack_68 [20];
  state_status_t local_54;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>_>_>
  *local_50;
  tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>
  local_48;
  
  local_54 = mask;
  local_50 = v;
  details::
  state_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>::
  construct<>((state_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>
               *)(auStack_68 + 8));
  syncprod::details::
  transition_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>
  ::construct<>((transition_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>
                 *)auStack_68);
  system = (this->_system).
           super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  s_00 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>
          ::operator*((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>
                       *)(auStack_68 + 8))->super_state_t;
  t_00 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>
          ::operator*((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>
                       *)auStack_68)->super_transition_t;
  sVar1 = ta::initial(system,s_00,t_00,init_edge);
  if ((local_54 & sVar1) != 0) {
    if (this->_sharing_type == SHARING) {
      details::
      state_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>::
      share(&(this->_state_allocator).
             super_state_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>
            ,(intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>
              *)(auStack_68 + 8));
      syncprod::details::
      transition_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>
      ::share((transition_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>
               *)&this->_transition_allocator,
              (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>
               *)auStack_68);
    }
    std::
    _Tuple_impl<1ul,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,unsigned_long,1ul>>>
    ::
    _Tuple_impl<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,unsigned_long,1ul>>&,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,unsigned_long,1ul>>&,void>
              ((_Tuple_impl<1ul,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,unsigned_long,1ul>>>
                *)&local_48,
               (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>
                *)(auStack_68 + 8),
               (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>
                *)auStack_68);
    local_48.
    super__Tuple_impl<0UL,_unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>
    .super__Head_base<0UL,_unsigned_int,_false>._M_head_impl = sVar1;
    std::
    vector<std::tuple<unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,unsigned_long,1ul>>>,std::allocator<std::tuple<unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,unsigned_long,1ul>>>>>
    ::
    emplace_back<std::tuple<unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,unsigned_long,1ul>>>>
              ((vector<std::tuple<unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,unsigned_long,1ul>>>,std::allocator<std::tuple<unsigned_int,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,unsigned_long,1ul>>>>>
                *)local_50,&local_48);
    std::
    _Tuple_impl<1UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>
    ::~_Tuple_impl((_Tuple_impl<1UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>
                    *)&local_48);
  }
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>::
  ~intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>
              *)auStack_68);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>::
  ~intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>
              *)(auStack_68 + 8));
  return;
}

Assistant:

void ta_t::initial(tchecker::ta::initial_value_t const & init_edge, std::vector<sst_t> & v, tchecker::state_status_t mask)
{
  tchecker::ta::state_sptr_t s = _state_allocator.construct();
  tchecker::ta::transition_sptr_t t = _transition_allocator.construct();
  tchecker::state_status_t status = tchecker::ta::initial(*_system, *s, *t, init_edge);
  if (status & mask) {
    if (_sharing_type == tchecker::ts::SHARING) {
      share(s);
      share(t);
    }
    v.push_back(std::make_tuple(status, s, t));
  }
}